

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

string * __thiscall pbrt::TriangleFilter::ToString_abi_cxx11_(TriangleFilter *this)

{
  string *in_RDI;
  Vector2<float> *in_stack_00000010;
  char *in_stack_00000018;
  
  StringPrintf<pbrt::Vector2<float>const&>(in_stack_00000018,in_stack_00000010);
  return in_RDI;
}

Assistant:

std::string TriangleFilter::ToString() const {
    return StringPrintf("[ TriangleFilter radius: %s ]", radius);
}